

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O0

toff_t MySeek(thandle_t opaque,toff_t offset,int whence)

{
  undefined8 local_38;
  undefined8 local_30;
  MyData *my_data;
  int whence_local;
  toff_t offset_local;
  thandle_t opaque_local;
  undefined8 local_8;
  
  if (whence == 1) {
    local_30 = *(long *)((long)opaque + 0x10);
  }
  else {
    if (whence == 0) {
      local_38 = 0;
    }
    else {
      local_38 = *(long *)((long)opaque + 8);
    }
    local_30 = local_38;
  }
  local_8 = local_30 + offset;
  if (*(ulong *)((long)opaque + 8) < local_8) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    *(ulong *)((long)opaque + 0x10) = local_8;
  }
  return local_8;
}

Assistant:

static toff_t MySeek(thandle_t opaque, toff_t offset, int whence) {
  MyData* const my_data = (MyData*)opaque;
  offset += (whence == SEEK_CUR) ? my_data->pos
          : (whence == SEEK_SET) ? 0
          : my_data->size;
  if (offset > my_data->size) return (toff_t)-1;
  my_data->pos = offset;
  return offset;
}